

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.cpp
# Opt level: O2

int __thiscall de::Socket::accept(Socket *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  deSocket *pdVar1;
  undefined8 *puVar2;
  SocketError *this_00;
  undefined4 in_register_00000034;
  allocator<char> local_39;
  string local_38;
  
  pdVar1 = deSocket_accept(this->m_socket,(deSocketAddress *)CONCAT44(in_register_00000034,__fd));
  if (pdVar1 != (deSocket *)0x0) {
    puVar2 = (undefined8 *)operator_new(8);
    *puVar2 = pdVar1;
    return (int)puVar2;
  }
  this_00 = (SocketError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Accepting connection to socket failed",&local_39);
  SocketError::SocketError(this_00,&local_38);
  __cxa_throw(this_00,&SocketError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Socket* Socket::accept (deSocketAddress* clientAddress)
{
	deSocket* clientSocket = deSocket_accept(m_socket, clientAddress);
	if (!clientSocket)
		throw SocketError("Accepting connection to socket failed");

	try
	{
		return new Socket(clientSocket);
	}
	catch (...)
	{
		deSocket_destroy(clientSocket);
		throw;
	}
}